

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogStream.cpp
# Opt level: O3

LogStream * __thiscall LogStream::operator<<(LogStream *this,longlong v)

{
  char **ppcVar1;
  char *buf;
  size_t sVar2;
  
  ppcVar1 = &(this->buffer_).cur_;
  buf = (this->buffer_).cur_;
  if (0x1f < (int)ppcVar1 - (int)buf) {
    sVar2 = convert<long_long>(buf,v);
    *ppcVar1 = *ppcVar1 + sVar2;
  }
  return this;
}

Assistant:

LogStream& LogStream::operator<<(long long v){
    formatInteger(v);
    return *this;
}